

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

double deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::fma
                 (double __x,double __y,double __z)

{
  ShaderType shaderType;
  bool bVar1;
  ContextType ctxType;
  char *__s;
  NotSupportedError *this;
  NegativeTestContext *in_RDI;
  long lVar2;
  double extraout_XMM0_Qa;
  DataType in_stack_ffffffffffffff08;
  allocator<char> local_f1;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*in_RDI->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"GL_EXT_gpu_shader5",(allocator<char> *)&shaderSource);
    bVar1 = NegativeTestContext::isExtensionSupported(in_RDI,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (!bVar1) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"This test requires a context version 3.2 or higher.",
                 "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_EXT_gpu_shader5\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
                 ,0x110f);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"fma",(allocator<char> *)&local_d0);
  NegativeTestContext::beginSection(in_RDI,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar2);
    bVar1 = NegativeTestContext::isShaderSupported(in_RDI,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,__s,&local_f1);
      std::operator+(&shaderSource,"Verify shader: ",&local_d0);
      NegativeTestContext::beginSection(in_RDI,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_d0);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceFma_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)in_RDI,
                 (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,TYPE_FLOAT,TYPE_INT,
                 in_stack_ffffffffffffff08);
      std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
      verifyShader(in_RDI,shaderType,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceFma_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)in_RDI,
                 (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,TYPE_INT,TYPE_FLOAT,
                 in_stack_ffffffffffffff08);
      std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
      verifyShader(in_RDI,shaderType,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceFma_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)in_RDI,
                 (NegativeTestContext *)(ulong)shaderType,0x1b,TYPE_FLOAT,TYPE_FLOAT,
                 in_stack_ffffffffffffff08);
      std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
      verifyShader(in_RDI,shaderType,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestContext::endSection(in_RDI);
    }
  }
  NegativeTestContext::endSection(in_RDI);
  return extraout_XMM0_Qa;
}

Assistant:

void fma (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_EXT_gpu_shader5"),
		"This test requires a context version 3.2 or higher.");

	ctx.beginSection("fma");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceFma(ctx, s_shaders[shaderNdx], glu::TYPE_FLOAT, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceFma(ctx, s_shaders[shaderNdx], glu::TYPE_FLOAT, glu::TYPE_INT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceFma(ctx, s_shaders[shaderNdx], glu::TYPE_INT, glu::TYPE_FLOAT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}